

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiMerger_p.h
# Opt level: O1

void __thiscall
BamTools::Internal::MultiMerger<BamTools::Algorithms::Sort::Unsorted>::Remove
          (MultiMerger<BamTools::Algorithms::Sort::Unsorted> *this,BamReader *reader)

{
  _Elt_pointer pMVar1;
  bool bVar2;
  int iVar3;
  _Map_pointer ppMVar4;
  MergeItem *item;
  _Elt_pointer pMVar5;
  _Elt_pointer pMVar6;
  bool bVar7;
  string filenameToRemove;
  undefined1 local_98 [32];
  ContainerType *local_78;
  string local_70;
  iterator local_50;
  
  if (reader != (BamReader *)0x0) {
    BamReader::GetFilename_abi_cxx11_(&local_70,reader);
    pMVar5 = (this->m_data).
             super__Deque_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pMVar1 = (this->m_data).
             super__Deque_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pMVar5 != pMVar1) {
      local_78 = &this->m_data;
      pMVar6 = (this->m_data).
               super__Deque_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppMVar4 = (this->m_data).
                super__Deque_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        if (pMVar5->Reader == (BamReader *)0x0) {
          bVar2 = false;
        }
        else {
          BamReader::GetFilename_abi_cxx11_((string *)local_98,pMVar5->Reader);
          if (local_98._8_8_ == local_70._M_string_length) {
            if ((MergeItem *)local_98._8_8_ == (MergeItem *)0x0) {
              bVar7 = true;
            }
            else {
              iVar3 = bcmp((void *)local_98._0_8_,local_70._M_dataplus._M_p,local_98._8_8_);
              bVar7 = iVar3 == 0;
            }
          }
          else {
            bVar7 = false;
          }
          if ((_Elt_pointer)local_98._0_8_ != (_Elt_pointer)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_);
          }
          bVar2 = false;
          if (bVar7) {
            local_98._8_8_ = *ppMVar4;
            local_98._16_8_ = local_98._8_8_ + 0x200;
            local_98._0_8_ = pMVar5;
            local_98._24_8_ = ppMVar4;
            std::
            deque<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>::
            _M_erase(&local_50,local_78,(iterator *)local_98);
            bVar2 = true;
          }
        }
        if (bVar2) break;
        pMVar5 = pMVar5 + 1;
        if (pMVar5 == pMVar6) {
          pMVar5 = ppMVar4[1];
          ppMVar4 = ppMVar4 + 1;
          pMVar6 = pMVar5 + 0x20;
        }
      } while (pMVar5 != pMVar1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

inline void MultiMerger<Algorithms::Sort::Unsorted>::Remove(BamReader* reader)
{

    if (reader == 0) return;
    const std::string filenameToRemove = reader->GetFilename();

    // iterate over readers in cache
    DataIterator dataIter = m_data.begin();
    DataIterator dataEnd = m_data.end();
    for (; dataIter != dataEnd; ++dataIter) {
        const MergeItem& item = (*dataIter);
        const BamReader* itemReader = item.Reader;
        if (itemReader == 0) continue;

        // remove iterator on match
        if (itemReader->GetFilename() == filenameToRemove) {
            m_data.erase(dataIter);
            return;
        }
    }
}